

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuThreadUtil.cpp
# Opt level: O0

void __thiscall tcu::ThreadUtil::MessageBuilder::operator<<(MessageBuilder *this,EndToken *param_1)

{
  Thread *this_00;
  string local_38;
  EndToken *local_18;
  EndToken *param_1_local;
  MessageBuilder *this_local;
  
  this_00 = this->m_thread;
  local_18 = param_1;
  param_1_local = (EndToken *)this;
  std::__cxx11::stringstream::str();
  Thread::pushMessage(this_00,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

void MessageBuilder::operator<< (const EndToken&)
{
	m_thread.pushMessage(m_stream.str());
}